

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteVmRelease(unqlite_vm *pVm)

{
  sxi32 sVar1;
  
  jx9_vm_release(pVm->pJx9Vm);
  sVar1 = SyMemBackendRelease(&pVm->sAlloc);
  return sVar1;
}

Assistant:

static int unqliteVmRelease(unqlite_vm *pVm)
{
	/* Release the Jx9 VM */
	jx9_vm_release(pVm->pJx9Vm);
	/* Release the private memory backend */
	SyMemBackendRelease(&pVm->sAlloc);
	/* Upper layer will discard this VM from the list
	 * of active VM.
	 */
	return UNQLITE_OK;
}